

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

string * __thiscall cmMakefile::GetRequiredDefinition(cmMakefile *this,string *name)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  cmValue local_28;
  cmValue def;
  string *name_local;
  cmMakefile *this_local;
  
  def.Value = name;
  if (GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetRequiredDefinition(std::__cxx11::string_const&)::
                                 empty_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_);
    }
  }
  local_28 = GetDefinition(this,def.Value);
  bVar1 = cmValue::operator_cast_to_bool(&local_28);
  if (bVar1) {
    this_local = (cmMakefile *)cmValue::operator*[abi_cxx11_(&local_28);
  }
  else {
    std::operator+(&local_48,
                   "Error required internal CMake variable not set, cmake may not be built correctly.\nMissing variable is:\n"
                   ,def.Value);
    cmSystemTools::Error(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    this_local = (cmMakefile *)&GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_
    ;
  }
  return (string *)this_local;
}

Assistant:

const std::string& cmMakefile::GetRequiredDefinition(
  const std::string& name) const
{
  static std::string const empty;
  cmValue def = this->GetDefinition(name);
  if (!def) {
    cmSystemTools::Error("Error required internal CMake variable not "
                         "set, cmake may not be built correctly.\n"
                         "Missing variable is:\n" +
                         name);
    return empty;
  }
  return *def;
}